

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  secp256k1_ecdsa_recoverable_signature *in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_context *in_RDI;
  int recid;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_ffffffffffffff98;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_40;
  secp256k1_ecdsa_signature *local_18;
  int local_4;
  
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
            ,0x4e,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_ecdsa_recoverable_signature_load
              (in_RDI,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0,
               (int *)&stack0xffffffffffffff9c,in_RDX);
    secp256k1_ecdsa_signature_save(local_18,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}